

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

JavascriptNativeFloatArray *
Js::JavascriptArray::BoxStackInstance<Js::JavascriptNativeFloatArray>
          (JavascriptNativeFloatArray *instance,bool deepCopy)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  DynamicTypeHandler *this;
  type_info *ptVar6;
  JavascriptNativeFloatArray *pJVar7;
  Recycler *pRVar8;
  type_info *ptVar9;
  Type *pTVar10;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  bVar3 = ThreadContext::IsOnStack(instance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2f6d,"(ThreadContext::IsOnStack(instance))",
                                "ThreadContext::IsOnStack(instance)");
    if (!bVar3) goto LAB_00b9e856;
    *puVar5 = 0;
  }
  if (deepCopy) {
    pTVar10 = (Type *)0x0;
  }
  else {
    pJVar7 = (JavascriptNativeFloatArray *)
             instance[-1].super_JavascriptNativeArray.weakRefToFuncBody.ptr;
    if (pJVar7 != (JavascriptNativeFloatArray *)0x0) {
      return pJVar7;
    }
    pTVar10 = &instance[-1].super_JavascriptNativeArray.weakRefToFuncBody;
  }
  this = DynamicObject::GetTypeHandler((DynamicObject *)instance);
  ptVar6 = (type_info *)DynamicTypeHandler::GetInlineSlotsSize(this);
  bVar3 = ThreadContext::IsOnStack
                    ((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr);
  if (bVar3 || deepCopy) {
    if (deepCopy) {
      pJVar7 = DeepCopyInstance<Js::JavascriptNativeFloatArray>(instance);
      goto LAB_00b9e83b;
    }
    pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    data.typeinfo =
         ptVar6 + (ulong)((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr)->
                         size * 8 + 0x18;
    local_60 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_6ad2a13;
    data.filename._0_4_ = 0x2f90;
    pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_60);
    uVar1 = ((instance->super_JavascriptNativeArray).super_JavascriptArray.head.ptr)->size;
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      data._32_8_ = __tls_get_addr(&PTR_01548f08);
      *(undefined4 *)data._32_8_ = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b9e856;
      *(undefined4 *)data._32_8_ = 0;
    }
    ptVar9 = (type_info *)&DAT_ffffffffffffffff;
    if (ptVar6 + (ulong)uVar1 * 8 + 0x18 < (type_info *)0xffffffffffffffc0) {
      ptVar9 = ptVar6 + (ulong)uVar1 * 8 + 0x58;
    }
    pJVar7 = (JavascriptNativeFloatArray *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                       (pRVar8,(size_t)ptVar9);
    if (pJVar7 == (JavascriptNativeFloatArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00b9e856:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    bVar3 = true;
  }
  else {
    pRVar8 = RecyclableObject::GetRecycler((RecyclableObject *)instance);
    if (ptVar6 == (type_info *)0x0) {
      local_60 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_6ad2a13;
      data.filename._0_4_ = 0x2f99;
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_60);
      pJVar7 = (JavascriptNativeFloatArray *)new<Memory::Recycler>(0x40,pRVar8,0x387914);
    }
    else {
      local_60 = (undefined1  [8])&JavascriptNativeFloatArray::typeinfo;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_6ad2a13;
      data.filename._0_4_ = 0x2f95;
      data.typeinfo = ptVar6;
      pRVar8 = Memory::Recycler::TrackAllocInfo(pRVar8,(TrackAllocData *)local_60);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00b9e856;
        *puVar5 = 0;
      }
      ptVar9 = (type_info *)&DAT_ffffffffffffffff;
      if (ptVar6 < (type_info *)0xffffffffffffffc0) {
        ptVar9 = ptVar6 + 0x40;
      }
      pJVar7 = (JavascriptNativeFloatArray *)
               Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                         (pRVar8,(size_t)ptVar9);
      if (pJVar7 == (JavascriptNativeFloatArray *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00b9e856;
        *puVar5 = 0;
      }
    }
    bVar3 = false;
  }
  JavascriptNativeFloatArray::JavascriptNativeFloatArray(pJVar7,instance,bVar3,false);
LAB_00b9e83b:
  if (pTVar10 != (Type *)0x0) {
    pTVar10->ptr = (RecyclerWeakReference<Js::FunctionBody> *)pJVar7;
  }
  return pJVar7;
}

Assistant:

T * JavascriptArray::BoxStackInstance(T * instance, bool deepCopy)
    {
        Assert(ThreadContext::IsOnStack(instance));
        T * boxedInstance;
        T ** boxedInstanceRef;
        if (!deepCopy)
        {
            // On the stack, the we reserved a pointer before the object as to store the boxed value
            boxedInstanceRef = ((T **)instance) - 1;
            boxedInstance = *boxedInstanceRef;
            if (boxedInstance)
            {
                return boxedInstance;
            }
        }
        else
        {
            // When doing a deep copy, do not cache the boxed value to ensure that only shallow copies
            // are reused
            boxedInstance = nullptr;
            boxedInstanceRef = nullptr;
        }

        const size_t inlineSlotsSize = instance->GetTypeHandler()->GetInlineSlotsSize();
        if (ThreadContext::IsOnStack(instance->head) || deepCopy)
        {
            // Reallocate both the object as well as the head segment when the head is on the stack or
            // when a deep copy is needed. This is to prevent a scenario where box may leave either one
            // on the stack when both must be on the heap.
            if (deepCopy)
            {
                boxedInstance = DeepCopyInstance(instance);
            }
            else
            {
                boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(),
                    inlineSlotsSize + sizeof(Js::SparseArraySegmentBase) + instance->head->size * sizeof(typename T::TElement),
                    T, instance, true /*boxHead*/, false /*deepCopy*/);
            }
        }
        else if(inlineSlotsSize)
        {
            boxedInstance = RecyclerNewPlusZ(instance->GetRecycler(), inlineSlotsSize, T, instance, false, false);
        }
        else
        {
            boxedInstance = RecyclerNew(instance->GetRecycler(), T, instance, false, false);
        }

        if (boxedInstanceRef != nullptr)
        {
            *boxedInstanceRef = boxedInstance;
        }
        return boxedInstance;
    }